

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1)

{
  bool bVar1;
  undefined1 local_a;
  undefined1 local_9;
  OpLayoutT_AsmReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if ((((DAT_0143bfdd == '\0') && (DAT_0143bfdc == '\0')) && (local_a = (undefined1)R0, R0 < 0x100))
     && (local_9 = (undefined1)R1, R1 < 0x100)) {
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_a,2,
               &this->super_ByteCodeWriter,false);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmReg2(OpCodeAsmJs op, RegSlot R0, RegSlot R1)
    {
        OpLayoutT_AsmReg2<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }